

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O1

void __thiscall
coro_io::io_context_pool::io_context_pool(io_context_pool *this,size_t pool_size,bool cpu_affinity)

{
  atomic_count *paVar1;
  impl_type *piVar2;
  element_type *peVar3;
  io_context *this_00;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *this_01;
  long lVar4;
  __single_object executor;
  io_context_ptr io_context;
  work_ptr work;
  _Head_base<0UL,_coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_*,_false>
  local_60;
  value_type local_58;
  value_type local_48;
  basic_executor_type<std::allocator<void>,_0UL> local_38;
  
  (this->work_).
  super__Vector_base<std::shared_ptr<asio::io_context::work>,_std::allocator<std::shared_ptr<asio::io_context::work>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->next_io_context_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->work_).
  super__Vector_base<std::shared_ptr<asio::io_context::work>,_std::allocator<std::shared_ptr<asio::io_context::work>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->work_).
  super__Vector_base<std::shared_ptr<asio::io_context::work>,_std::allocator<std::shared_ptr<asio::io_context::work>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->executors).
  super__Vector_base<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->executors).
  super__Vector_base<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->io_contexts_).
  super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->executors).
  super__Vector_base<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->io_contexts_).
  super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->io_contexts_).
  super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::promise<void>::promise(&this->promise_);
  (this->has_run_or_stop_)._M_base._M_i = false;
  (this->flag_)._M_once = 0;
  lVar4 = pool_size + (pool_size == 0);
  this->cpu_affinity_ = cpu_affinity;
  LOCK();
  total_thread_num_.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       ((long)total_thread_num_.super___atomic_base<unsigned_long>._M_i + lVar4);
  UNLOCK();
  do {
    this_00 = (io_context *)operator_new(0x10);
    asio::io_context::io_context(this_00,1);
    local_58.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<asio::io_context*>
              (&local_58.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,this_00);
    local_48.super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(8);
    piVar2 = (local_58.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             impl_;
    (local_48.super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    io_context_impl_ = piVar2;
    LOCK();
    paVar1 = &piVar2->outstanding_work_;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<asio::io_context::work*>
              (&local_48.super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               local_48.super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    std::
    vector<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>::
    push_back(&this->io_contexts_,&local_58);
    peVar3 = local_58.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_01 = (ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *)
              operator_new(0x30);
    local_38.target_ = (uintptr_t)peVar3;
    ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
    ExecutorWrapper(this_01,&local_38);
    local_60._M_head_impl = this_01;
    std::
    vector<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>,std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>>>,std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>,std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>>>>>
    ::
    emplace_back<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>,std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>>>>
              ((vector<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>,std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>>>,std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>,std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>>>>>
                *)&this->executors,
               (unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>
                *)&local_60);
    std::
    vector<std::shared_ptr<asio::io_context::work>,_std::allocator<std::shared_ptr<asio::io_context::work>_>_>
    ::push_back(&this->work_,&local_48);
    if (local_60._M_head_impl !=
        (ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *)0x0) {
      (*((local_60._M_head_impl)->super_Executor)._vptr_Executor[1])();
    }
    if (local_48.super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_58.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  return;
}

Assistant:

explicit io_context_pool(std::size_t pool_size, bool cpu_affinity = false)
      : next_io_context_(0), cpu_affinity_(cpu_affinity) {
    if (pool_size == 0) {
      pool_size = 1;  // set default value as 1
    }

    total_thread_num_ += pool_size;

    for (std::size_t i = 0; i < pool_size; ++i) {
      io_context_ptr io_context(new asio::io_context(1));
      work_ptr work(new asio::io_context::work(*io_context));
      io_contexts_.push_back(io_context);
      auto executor = std::make_unique<coro_io::ExecutorWrapper<>>(
          io_context->get_executor());
      executors.push_back(std::move(executor));
      work_.push_back(work);
    }
  }